

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::AssertionResult::~AssertionResult(AssertionResult *this)

{
  AssertionResultData::~AssertionResultData((AssertionResultData *)this);
  return;
}

Assistant:

AssertionResult() = delete;